

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

bool __thiscall
cmFileInstaller::Parse
          (cmFileInstaller *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
  __l;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  allocator_type local_b9;
  string e;
  string install_mode;
  
  bVar2 = cmFileCopier::Parse(&this->super_cmFileCopier,args);
  if (!bVar2) {
    return false;
  }
  if ((this->Rename)._M_string_length != 0) {
    if ((this->super_cmFileCopier).FilesFromDir._M_string_length != 0) {
      pcVar1 = (this->super_cmFileCopier).Status;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&install_mode,
                 "INSTALL option RENAME may not be combined with FILES_FROM_DIR.",
                 (allocator<char> *)&e);
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      goto LAB_003455af;
    }
    if ((*(uint *)&(this->super_cmFileCopier).field_0xf4 & 0xfffffffe) != 4) {
      pcVar1 = (this->super_cmFileCopier).Status;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&install_mode,
                 "INSTALL option RENAME may be used only with FILES or PROGRAMS.",
                 (allocator<char> *)&e);
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      goto LAB_003455af;
    }
    if (0x20 < (ulong)((long)(this->super_cmFileCopier).Files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_cmFileCopier).Files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pcVar1 = (this->super_cmFileCopier).Status;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&install_mode,"INSTALL option RENAME may be used only with one file.",
                 (allocator<char> *)&e);
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      goto LAB_003455af;
    }
  }
  bVar2 = HandleInstallDestination(this);
  if (!bVar2) {
    return false;
  }
  if (1 < (byte)(this->MessageLazy + this->MessageAlways + this->MessageNever)) {
    pcVar1 = (this->super_cmFileCopier).Status;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&install_mode,
               "INSTALL options MESSAGE_ALWAYS, MESSAGE_LAZY, and MESSAGE_NEVER are mutually exclusive."
               ,(allocator<char> *)&e);
    std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
LAB_003455af:
    std::__cxx11::string::~string((string *)&install_mode);
    return false;
  }
  if ((Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::
       install_mode_dict == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::install_mode_dict), iVar3 != 0)) {
    install_mode._M_dataplus._M_p = (pointer)0xb;
    install_mode._M_string_length = (size_type)anon_var_dwarf_1046f14;
    install_mode.field_2._M_allocated_capacity._0_4_ = 1;
    install_mode.field_2._8_8_ = 0x13;
    __l._M_len = 6;
    __l._M_array = (iterator)&install_mode;
    std::
    map<std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
    ::map(&Parse::install_mode_dict,__l,
          (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)&e,&local_b9);
    __cxa_atexit(std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
                 ::~map,&Parse::install_mode_dict,&__dso_handle);
    __cxa_guard_release(&Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::install_mode_dict);
  }
  install_mode._M_dataplus._M_p = (pointer)&install_mode.field_2;
  install_mode._M_string_length = 0;
  install_mode.field_2._M_allocated_capacity._0_4_ =
       install_mode.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  cmsys::SystemTools::GetEnv("CMAKE_INSTALL_MODE",&install_mode);
  if ((install_mode._M_string_length == 0) ||
     (__y._M_str = "COPY", __y._M_len = 4, __x._M_str = install_mode._M_dataplus._M_p,
     __x._M_len = install_mode._M_string_length, bVar2 = std::operator==(__x,__y), bVar2)) {
    this->InstallMode = COPY;
  }
  else {
    e._M_dataplus._M_p = (pointer)install_mode._M_string_length;
    e._M_string_length = (size_type)install_mode._M_dataplus._M_p;
    cVar4 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
            ::find(&Parse::install_mode_dict._M_t,(key_type *)&e);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &Parse::install_mode_dict._M_t._M_impl.super__Rb_tree_header) {
      cmStrCat<char_const(&)[21],std::__cxx11::string&,char_const(&)[46]>
                (&e,(char (*) [21])"Unrecognized value \'",&install_mode,
                 (char (*) [46])"\' for environment variable CMAKE_INSTALL_MODE");
      std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
      std::__cxx11::string::~string((string *)&e);
      bVar2 = false;
      goto LAB_0034565a;
    }
    this->InstallMode = *(cmInstallMode *)&cVar4._M_node[1]._M_left;
  }
  bVar2 = true;
LAB_0034565a:
  std::__cxx11::string::~string((string *)&install_mode);
  return bVar2;
}

Assistant:

bool cmFileInstaller::Parse(std::vector<std::string> const& args)
{
  if (!this->cmFileCopier::Parse(args)) {
    return false;
  }

  if (!this->Rename.empty()) {
    if (!this->FilesFromDir.empty()) {
      this->Status.SetError("INSTALL option RENAME may not be "
                            "combined with FILES_FROM_DIR.");
      return false;
    }
    if (this->InstallType != cmInstallType_FILES &&
        this->InstallType != cmInstallType_PROGRAMS) {
      this->Status.SetError("INSTALL option RENAME may be used "
                            "only with FILES or PROGRAMS.");
      return false;
    }
    if (this->Files.size() > 1) {
      this->Status.SetError("INSTALL option RENAME may be used "
                            "only with one file.");
      return false;
    }
  }

  if (!this->HandleInstallDestination()) {
    return false;
  }

  if (((this->MessageAlways ? 1 : 0) + (this->MessageLazy ? 1 : 0) +
       (this->MessageNever ? 1 : 0)) > 1) {
    this->Status.SetError("INSTALL options MESSAGE_ALWAYS, "
                          "MESSAGE_LAZY, and MESSAGE_NEVER "
                          "are mutually exclusive.");
    return false;
  }

  static const std::map<cm::string_view, cmInstallMode> install_mode_dict{
    { "ABS_SYMLINK"_s, cmInstallMode::ABS_SYMLINK },
    { "ABS_SYMLINK_OR_COPY"_s, cmInstallMode::ABS_SYMLINK_OR_COPY },
    { "REL_SYMLINK"_s, cmInstallMode::REL_SYMLINK },
    { "REL_SYMLINK_OR_COPY"_s, cmInstallMode::REL_SYMLINK_OR_COPY },
    { "SYMLINK"_s, cmInstallMode::SYMLINK },
    { "SYMLINK_OR_COPY"_s, cmInstallMode::SYMLINK_OR_COPY }
  };

  std::string install_mode;
  cmSystemTools::GetEnv("CMAKE_INSTALL_MODE", install_mode);
  if (install_mode.empty() || install_mode == "COPY"_s) {
    this->InstallMode = cmInstallMode::COPY;
  } else {
    auto it = install_mode_dict.find(install_mode);
    if (it != install_mode_dict.end()) {
      this->InstallMode = it->second;
    } else {
      auto e = cmStrCat("Unrecognized value '", install_mode,
                        "' for environment variable CMAKE_INSTALL_MODE");
      this->Status.SetError(e);
      return false;
    }
  }

  return true;
}